

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void cornelich::util::touch(string *path)

{
  runtime_error *this;
  ofstream f;
  string asStack_3c8 [32];
  stringstream local_3a8 [16];
  ostream local_398 [376];
  long local_220;
  filebuf local_218 [24];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(path->_M_dataplus)._M_p,_S_out);
  if ((abStack_200[*(long *)(local_220 + -0x18)] & 5) == 0) {
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::stringstream(local_3a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_398,"Failed to create/open file ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_398,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_3c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void touch(const std::string & path)
{
    std::ofstream f(path.c_str());
    if (!f)
    {
        throw std::runtime_error(util::streamer() << "Failed to create/open file " << path);
    }
}